

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enums.cpp
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,FENCING_STRATEGY strategy)

{
  mapped_type *pmVar1;
  long lVar2;
  initializer_list<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined1 local_70 [8];
  map<FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FENCING_STRATEGY>,_std::allocator<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  FENCING_STRATEGY local_38;
  FENCING_STRATEGY local_34;
  FENCING_STRATEGY local_30;
  less<FENCING_STRATEGY> local_2a;
  allocator_type local_29;
  FENCING_STRATEGY strategy_local;
  
  map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 2;
  local_30 = strategy;
  std::
  pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<FENCING_STRATEGY,_const_char_(&)[16],_true>
            (&local_e8,
             (FENCING_STRATEGY *)((long)&map._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),
             (char (*) [16])"LATEST_POSSIBLE");
  local_38 = EARLIEST_POSSIBLE;
  std::
  pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<FENCING_STRATEGY,_const_char_(&)[18],_true>
            (&local_c0,&stack0xffffffffffffffc8,(char (*) [18])"EARLIEST_POSSIBLE");
  local_34 = OMIT_FENCING;
  std::
  pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<FENCING_STRATEGY,_const_char_(&)[13],_true>
            (&local_98,&stack0xffffffffffffffcc,(char (*) [13])"OMIT_FENCING");
  __l._M_len = 3;
  __l._M_array = &local_e8;
  std::
  map<FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FENCING_STRATEGY>,_std::allocator<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FENCING_STRATEGY>,_std::allocator<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_70,__l,&local_2a,&local_29);
  lVar2 = 0x58;
  do {
    std::__cxx11::string::~string((string *)((long)&local_e8.first + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  pmVar1 = std::
           map<FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FENCING_STRATEGY>,_std::allocator<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at((map<FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<FENCING_STRATEGY>,_std::allocator<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_70,&stack0xffffffffffffffd0);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar1);
  std::
  _Rb_tree<FENCING_STRATEGY,_std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<FENCING_STRATEGY>,_std::allocator<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<FENCING_STRATEGY,_std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<FENCING_STRATEGY>,_std::allocator<std::pair<const_FENCING_STRATEGY,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(FENCING_STRATEGY strategy) {
  std::map<FENCING_STRATEGY, std::string> map =
      {
          {FENCING_STRATEGY::LATEST_POSSIBLE, "LATEST_POSSIBLE"},
          {FENCING_STRATEGY::EARLIEST_POSSIBLE, "EARLIEST_POSSIBLE"},
          {FENCING_STRATEGY::OMIT_FENCING, "OMIT_FENCING"}
      };
  return map.at(strategy);
}